

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O0

void __thiscall
cmOSXBundleGenerator::CreateAppBundle
          (cmOSXBundleGenerator *this,string *targetName,string *outpath,string *config)

{
  bool bVar1;
  string local_180;
  cmAlphaNum local_160;
  cmAlphaNum local_130;
  undefined1 local_100 [8];
  string plist;
  string local_c8;
  cmAlphaNum local_a8;
  cmAlphaNum local_78;
  undefined1 local_48 [8];
  string out;
  string *config_local;
  string *outpath_local;
  string *targetName_local;
  cmOSXBundleGenerator *this_local;
  
  out.field_2._8_8_ = config;
  bVar1 = MustSkip(this);
  if (!bVar1) {
    cmAlphaNum::cmAlphaNum(&local_78,outpath);
    cmAlphaNum::cmAlphaNum(&local_a8,'/');
    cmGeneratorTarget::GetAppBundleDirectory
              (&local_c8,this->GT,(string *)out.field_2._8_8_,FullLevel);
    cmStrCat<std::__cxx11::string>((string *)local_48,&local_78,&local_a8,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    register0x00000000 = cmsys::SystemTools::MakeDirectory((string *)local_48,(mode_t *)0x0);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_48);
    cmAlphaNum::cmAlphaNum(&local_130,outpath);
    cmAlphaNum::cmAlphaNum(&local_160,'/');
    cmGeneratorTarget::GetAppBundleDirectory
              (&local_180,this->GT,(string *)out.field_2._8_8_,ContentLevel);
    cmStrCat<std::__cxx11::string,char[12]>
              ((string *)local_100,&local_130,&local_160,&local_180,(char (*) [12])"/Info.plist");
    std::__cxx11::string::~string((string *)&local_180);
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,targetName,(string *)local_100);
    cmMakefile::AddCMakeOutputFile(this->Makefile,(string *)local_100);
    std::__cxx11::string::operator=((string *)outpath,(string *)local_48);
    std::__cxx11::string::~string((string *)local_100);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath,
                                           const std::string& config)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::FullLevel));
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = cmStrCat(
    outpath, '/',
    this->GT->GetAppBundleDirectory(config, cmGeneratorTarget::ContentLevel),
    "/Info.plist");
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, targetName, plist);
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = out;
}